

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Apu.cpp
# Opt level: O0

void __thiscall Hes_Apu::write_data(Hes_Apu *this,blip_time_t time,int addr,int data)

{
  byte bVar1;
  Hes_Osc *osc_00;
  uint in_ECX;
  int in_EDX;
  Hes_Apu *in_RDI;
  Hes_Osc *osc_1;
  Hes_Osc *osc;
  Hes_Apu *local_20;
  
  if (in_EDX == 0x800) {
    in_RDI->latch = in_ECX & 7;
  }
  else if (in_EDX == 0x801) {
    if (in_RDI->balance != in_ECX) {
      in_RDI->balance = in_ECX;
      local_20 = (Hes_Apu *)&in_RDI->latch;
      do {
        local_20 = (Hes_Apu *)(local_20[-1].synth.impulses + 0xcc);
        Hes_Osc::run_until(this->oscs,(synth_t *)CONCAT44(time,addr),data);
        balance_changed(in_RDI,in_RDI->oscs);
      } while (local_20 != in_RDI);
    }
  }
  else if (in_RDI->latch < 6) {
    osc_00 = in_RDI->oscs + in_RDI->latch;
    Hes_Osc::run_until(this->oscs,(synth_t *)CONCAT44(time,addr),data);
    bVar1 = (byte)in_ECX;
    switch(in_EDX) {
    case 0x802:
      osc_00->period = osc_00->period & 0xf00U | in_ECX;
      break;
    case 0x803:
      osc_00->period = osc_00->period & 0xffU | (in_ECX & 0xf) << 8;
      break;
    case 0x804:
      if ((osc_00->control & 0x40 & (in_ECX ^ 0xffffffff)) != 0) {
        osc_00->phase = '\0';
      }
      osc_00->control = bVar1;
      balance_changed(in_RDI,osc_00);
      break;
    case 0x805:
      osc_00->balance = bVar1;
      balance_changed(in_RDI,osc_00);
      break;
    case 0x806:
      if ((osc_00->control & 0x40) == 0) {
        osc_00->wave[osc_00->phase] = bVar1 & 0x1f;
        osc_00->phase = osc_00->phase + 1 & 0x1f;
      }
      else if ((osc_00->control & 0x80) != 0) {
        osc_00->dac = bVar1 & 0x1f;
      }
      break;
    case 0x807:
      if (in_RDI->oscs + 4 <= osc_00) {
        osc_00->noise = bVar1;
      }
      break;
    case 0x809:
    }
  }
  return;
}

Assistant:

void Hes_Apu::write_data( blip_time_t time, int addr, int data )
{
	if ( addr == 0x800 )
	{
		latch = data & 7;
	}
	else if ( addr == 0x801 )
	{
		if ( balance != data )
		{
			balance = data;
			
			Hes_Osc* osc = &oscs [osc_count];
			do
			{
				osc--;
				osc->run_until( synth, time );
				balance_changed( *oscs );
			}
			while ( osc != oscs );
		}
	}
	else if ( latch < osc_count )
	{
		Hes_Osc& osc = oscs [latch];
		osc.run_until( synth, time );
		switch ( addr )
		{
		case 0x802:
			osc.period = (osc.period & 0xF00) | data;
			break;
		
		case 0x803:
			osc.period = (osc.period & 0x0FF) | ((data & 0x0F) << 8);
			break;
		
		case 0x804:
			if ( osc.control & 0x40 & ~data )
				osc.phase = 0;
			osc.control = data;
			balance_changed( osc );
			break;
		
		case 0x805:
			osc.balance = data;
			balance_changed( osc );
			break;
		
		case 0x806:
			data &= 0x1F;
			if ( !(osc.control & 0x40) )
			{
				osc.wave [osc.phase] = data;
				osc.phase = (osc.phase + 1) & 0x1F;
			}
			else if ( osc.control & 0x80 )
			{
				osc.dac = data;
			}
			break;
		
		 case 0x807:
		 	if ( &osc >= &oscs [4] )
		 		osc.noise = data;
		 	break;
		 
		 case 0x809:
		 	if ( !(data & 0x80) && (data & 0x03) != 0 )
		 		debug_printf( "HES LFO not supported\n" );
		}
	}
}